

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::CleanPolygons(Paths *in_polys,Paths *out_polys,double distance)

{
  pointer pvVar1;
  long lVar2;
  size_type i;
  ulong uVar3;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::resize(out_polys,
           ((long)(in_polys->
                  super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
           (long)(in_polys->
                 super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start) / 0x18);
  lVar2 = 0;
  for (uVar3 = 0;
      pvVar1 = (in_polys->
               super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)(((long)(in_polys->
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18);
      uVar3 = uVar3 + 1) {
    CleanPolygon((Path *)((long)&(pvVar1->
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 )._M_impl.super__Vector_impl_data + lVar2),
                 (Path *)((long)&(((out_polys->
                                   super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                                 )._M_impl.super__Vector_impl_data + lVar2),distance);
    lVar2 = lVar2 + 0x18;
  }
  return;
}

Assistant:

void CleanPolygons(const Paths& in_polys, Paths& out_polys, double distance)
{
  out_polys.resize(in_polys.size());
  for (Paths::size_type i = 0; i < in_polys.size(); ++i)
    CleanPolygon(in_polys[i], out_polys[i], distance);
}